

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::setGhosted(Application *this,bool isGhosted)

{
  Scene *pSVar1;
  _Rb_tree_node_base *p_Var2;
  
  this->isGhosted = isGhosted;
  pSVar1 = this->scene;
  for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    *(bool *)(*(long *)(p_Var2 + 1) + 0xe9) = isGhosted;
  }
  return;
}

Assistant:

void Application::setGhosted(bool isGhosted)
{
  this->isGhosted = isGhosted;
  for (auto object : scene->objects)
  {
    object->isGhosted = isGhosted;
  }
}